

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O1

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::writeInFile(IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *this,char *filename,bool clearLog,bool append)

{
  _Map_pointer ppMVar1;
  _Map_pointer ppMVar2;
  _Elt_pointer pMVar3;
  long lVar4;
  char cVar5;
  ostream *poVar6;
  runtime_error *this_00;
  long lVar7;
  ulong uVar8;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar9;
  ulong uVar10;
  TimeIndex TVar11;
  runtime_error e;
  ofstream f;
  stringstream ss;
  runtime_error local_3e8 [16];
  char *local_3d8;
  char local_3c8 [16];
  long local_3b8;
  filebuf local_3b0 [240];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::ofstream::ofstream((ofstream *)&local_3b8);
  std::ofstream::open((char *)&local_3b8,(_Ios_Openmode)filename);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Logger: File ",0xd);
    poVar6 = std::operator<<(local_1a8,filename);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," could not be created/opened.",0x1d);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(local_3e8,local_3d8);
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_3e8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppMVar1 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (0 < (long)(((long)(this->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)(this->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                 ((long)(this->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(this->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                ((((ulong)((long)ppMVar1 -
                          (long)(this->v_).
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x20)) {
    for (TVar11 = this->k_;
        ppMVar1 = (this->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,
        TVar11 < (long)(((long)(this->v_).
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->v_).
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) + this->k_ +
                       ((long)(this->v_).
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->v_).
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                       ((((ulong)((long)ppMVar1 -
                                 (long)(this->v_).
                                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                       + (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x20); TVar11 = TVar11 + 1) {
      std::ostream::_M_insert<long>((long)&local_3b8);
      ppMVar1 = (this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppMVar2 = (this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      pMVar3 = (this->v_).
               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      lVar7 = ((long)(this->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar3 >> 4) +
              ((long)(this->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(this->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)ppMVar1 - (long)ppMVar2) >> 3) - 1) +
              (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x20;
      if (lVar7 == 0) {
LAB_001045cc:
        __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                      ,0x192,
                      "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                     );
      }
      lVar4 = this->k_;
      if ((TVar11 < lVar4) || (lVar4 + lVar7 <= TVar11)) goto LAB_001045cc;
      uVar8 = ((long)pMVar3 -
               (long)(this->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (TVar11 - lVar4);
      if (uVar8 < 0x20) {
        pMVar9 = pMVar3 + (TVar11 - lVar4);
      }
      else {
        uVar10 = (uVar8 >> 5) + 0xf800000000000000;
        if (0 < (long)uVar8) {
          uVar10 = uVar8 >> 5;
        }
        pMVar9 = ppMVar2[uVar10] + uVar8 + uVar10 * -0x20;
      }
      if (0 < (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows) {
        lVar7 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b8," ",1);
          if ((pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar7) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          std::ostream::_M_insert<double>
                    ((pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows);
      }
      cVar5 = (char)(ofstream *)&local_3b8;
      std::ios::widen((char)*(undefined8 *)(local_3b8 + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
    }
  }
  if (clearLog) {
    ppMVar1 = (this->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    this->k_ = ((long)(this->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) + this->k_ +
               ((long)(this->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((((ulong)((long)ppMVar1 -
                         (long)(this->v_).
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x20;
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::clear(&this->v_);
  }
  local_3b8 = _VTT;
  *(undefined8 *)(local_3b0 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_3b0);
  std::ios_base::~ios_base(local_2c0);
  return;
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::writeInFile(const char * filename, bool clearLog, bool append)
{
  std::ofstream f;
  if (!append)
  {
    f.open(filename);
  }
  else
  {
    f.open(filename,std::ofstream::app);
  }

  if (f.is_open())
  {
    if (size()>0)
    {

      for (TimeIndex k=getFirstIndex(); k<getNextIndex(); ++k)
      {

        f << k;

        MatrixType & m = operator[](k);

        for (int i = 0 ; i< m.rows(); ++i)
        {
          for (int j = 0 ; j< m.cols(); ++j)
          {
            f << " "<< m(i,j);
          }
        }
        f << std::endl;
      }
    }

    if (clearLog)
    {
      clear();
    }
  }
  else
  {
    std::stringstream ss;
    ss<< "Logger: File " <<filename<<" could not be created/opened.";
    std::runtime_error e(ss.str().c_str());
    throw e;
  }

}